

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_directory_descriptor.c
# Opt level: O0

directory_descriptor directory_descriptor_create(directory_descriptor parent,char *path)

{
  vector pvVar1;
  char *in_RSI;
  directory_descriptor in_RDI;
  directory_descriptor d;
  directory_descriptor local_8;
  
  local_8 = (directory_descriptor)malloc(0x210);
  if (local_8 == (directory_descriptor)0x0) {
    local_8 = (directory_descriptor)0x0;
  }
  else {
    pvVar1 = (vector)vector_create(8);
    local_8->files = pvVar1;
    if (local_8->files == (vector)0x0) {
      log_write_impl_va("metacall",0x3a,"directory_descriptor_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/filesystem/source/filesystem_directory_descriptor.c"
                        ,3,"Directory descriptor invalid file allocation");
      free(local_8);
      local_8 = (directory_descriptor)0x0;
    }
    else {
      local_8->parent = in_RDI;
      strncpy(local_8->path,in_RSI,0x1ff);
    }
  }
  return local_8;
}

Assistant:

directory_descriptor directory_descriptor_create(directory_descriptor parent, const char *path)
{
	directory_descriptor d = malloc(sizeof(struct directory_descriptor_type));

	if (d != NULL)
	{
		d->files = vector_create(sizeof(file_descriptor));

		if (d->files == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Directory descriptor invalid file allocation");

			free(d);

			return NULL;
		}

		d->parent = parent;

		strncpy(d->path, path, DIRECTORY_DESCRIPTOR_PATH_SIZE - 1);

		return d;
	}

	return NULL;
}